

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O2

int64_t av1_refine_integerized_param
                  (WarpedMotionParams *wm,TransformationType wmtype,int use_hbd,int bd,uint8_t *ref,
                  int r_width,int r_height,int r_stride,uint8_t *dst,int d_width,int d_height,
                  int d_stride,int n_refinements,int64_t ref_frame_error,uint8_t *segment_map,
                  int segment_map_stride,double gm_erroradv_tr)

{
  uint uVar1;
  byte bVar2;
  TransformationType TVar3;
  int offset;
  int32_t iVar4;
  int32_t iVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  ulong uVar9;
  int offset_00;
  uint uVar10;
  int iVar12;
  undefined7 in_register_00000031;
  int iVar13;
  ulong uVar14;
  int p_height;
  int in_stack_ffffffffffffff88;
  int iVar15;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ulong uVar11;
  
  uVar1 = av1_refine_integerized_param::max_trans_model_params
          [CONCAT71(in_register_00000031,wmtype) & 0xffffffff];
  force_wmtype(wm,wmtype);
  TVar3 = get_wmtype(wm);
  wm->wmtype = TVar3;
  p_height = (int)segment_map;
  if (n_refinements == 0) {
    lVar7 = lrint((double)ref_frame_error * gm_erroradv_tr);
    lVar7 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,d_width,d_height
                           ,(int)lVar7,p_height,segment_map_stride,in_stack_ffffffffffffff88,
                           CONCAT44(in_stack_ffffffffffffff94,r_width),
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           (int)ref);
  }
  else {
    lVar6 = lrint((double)ref_frame_error * 0.7);
    lVar7 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,d_width,d_height
                           ,(int)lVar6,p_height,segment_map_stride,in_stack_ffffffffffffff88,
                           CONCAT44(in_stack_ffffffffffffff94,r_width),
                           (uint8_t *)CONCAT44(bd,use_hbd),(int)ref);
    if (lVar6 < lVar7) {
      lVar7 = 0x7fffffffffffffff;
    }
    else {
      bVar2 = (char)n_refinements - 1U & 0x1f;
      offset_00 = 1 << bVar2;
      uVar10 = 0 << bVar2;
      uVar11 = (ulong)uVar10;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar11;
      }
      iVar15 = r_width;
      if (n_refinements < 1) {
        n_refinements = uVar10;
      }
      for (; (uint)uVar11 != n_refinements; uVar11 = (ulong)((uint)uVar11 + 1)) {
        offset = -offset_00;
        uVar14 = 0;
LAB_0034d632:
        if (uVar14 != uVar9) {
          iVar5 = wm->wmmat[uVar14];
          iVar13 = (int)uVar14;
          iVar4 = add_param_offset(iVar13,iVar5,offset);
          wm->wmmat[uVar14] = iVar4;
          force_wmtype(wm,wmtype);
          iVar8 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,d_width,
                                 d_height,(int)lVar7,p_height,segment_map_stride,
                                 in_stack_ffffffffffffff88,CONCAT44(offset_00,iVar15),
                                 (uint8_t *)CONCAT44(bd,use_hbd),(int)ref);
          iVar12 = 0;
          iVar4 = iVar5;
          if (iVar8 < lVar7) {
            iVar4 = wm->wmmat[uVar14];
            iVar12 = -1;
            lVar7 = iVar8;
          }
          iVar5 = add_param_offset(iVar13,iVar5,offset_00);
          wm->wmmat[uVar14] = iVar5;
          force_wmtype(wm,wmtype);
          iVar8 = get_warp_error(wm,use_hbd,bd,ref,iVar15,r_height,r_stride,dst,d_stride,d_width,
                                 d_height,(int)lVar7,p_height,segment_map_stride,
                                 in_stack_ffffffffffffff88,CONCAT44(offset_00,iVar15),
                                 (uint8_t *)CONCAT44(bd,use_hbd),(int)ref);
          r_width = iVar15;
          if (lVar7 <= iVar8) goto LAB_0034d755;
          iVar15 = 1;
          do {
            iVar4 = wm->wmmat[uVar14];
            iVar12 = iVar15;
            lVar7 = iVar8;
LAB_0034d755:
            do {
              iVar15 = iVar12;
              if (iVar15 == 0) {
                wm->wmmat[uVar14] = iVar4;
                force_wmtype(wm,wmtype);
                uVar14 = uVar14 + 1;
                iVar15 = r_width;
                goto LAB_0034d632;
              }
              iVar5 = add_param_offset(iVar13,iVar4,iVar15 * offset_00);
              wm->wmmat[uVar14] = iVar5;
              force_wmtype(wm,wmtype);
              iVar8 = get_warp_error(wm,use_hbd,bd,ref,r_width,r_height,r_stride,dst,d_stride,
                                     d_width,d_height,(int)lVar7,p_height,segment_map_stride,
                                     in_stack_ffffffffffffff88,CONCAT44(offset_00,r_width),
                                     (uint8_t *)CONCAT44(bd,use_hbd),(int)ref);
              iVar12 = 0;
            } while (lVar7 <= iVar8);
          } while( true );
        }
        offset_00 = offset_00 >> 1;
      }
      TVar3 = get_wmtype(wm);
      wm->wmtype = TVar3;
      av1_get_shear_params(wm);
    }
  }
  return lVar7;
}

Assistant:

int64_t av1_refine_integerized_param(
    WarpedMotionParams *wm, TransformationType wmtype, int use_hbd, int bd,
    uint8_t *ref, int r_width, int r_height, int r_stride, uint8_t *dst,
    int d_width, int d_height, int d_stride, int n_refinements,
    int64_t ref_frame_error, uint8_t *segment_map, int segment_map_stride,
    double gm_erroradv_tr) {
  static const int max_trans_model_params[TRANS_TYPES] = { 0, 2, 4, 6 };
  const int border = ERRORADV_BORDER;
  int i = 0, p;
  int n_params = max_trans_model_params[wmtype];
  int32_t *param_mat = wm->wmmat;
  int64_t step_error, best_error;
  int32_t step;
  int32_t *param;
  int32_t curr_param;
  int32_t best_param;

  force_wmtype(wm, wmtype);
  wm->wmtype = get_wmtype(wm);

  if (n_refinements == 0) {
    // Compute the maximum error value that will be accepted, so that
    // get_warp_error can terminate early if it proves the model will not
    // be accepted.
    int64_t selection_threshold =
        (int64_t)lrint(ref_frame_error * gm_erroradv_tr);
    return get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                          dst + border * d_stride + border, d_stride, border,
                          border, d_width - 2 * border, d_height - 2 * border,
                          0, 0, selection_threshold, segment_map,
                          segment_map_stride);
  }

  // When refining, use a slightly higher threshold for the initial error
  // calculation - see comment above erroradv_early_tr for why.
  int64_t selection_threshold =
      (int64_t)lrint(ref_frame_error * erroradv_early_tr);
  best_error =
      get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                     dst + border * d_stride + border, d_stride, border, border,
                     d_width - 2 * border, d_height - 2 * border, 0, 0,
                     selection_threshold, segment_map, segment_map_stride);

  if (best_error > selection_threshold) {
    return INT64_MAX;
  }

  step = 1 << (n_refinements - 1);
  for (i = 0; i < n_refinements; i++, step >>= 1) {
    for (p = 0; p < n_params; ++p) {
      int step_dir = 0;
      param = param_mat + p;
      curr_param = *param;
      best_param = curr_param;
      // look to the left
      // Note: We have to use force_wmtype() to keep the proper symmetry for
      // ROTZOOM type models
      *param = add_param_offset(p, curr_param, -step);
      force_wmtype(wm, wmtype);
      step_error =
          get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                         dst + border * d_stride + border, d_stride, border,
                         border, d_width - 2 * border, d_height - 2 * border, 0,
                         0, best_error, segment_map, segment_map_stride);
      if (step_error < best_error) {
        best_error = step_error;
        best_param = *param;
        step_dir = -1;
      }

      // look to the right
      *param = add_param_offset(p, curr_param, step);
      force_wmtype(wm, wmtype);
      step_error =
          get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                         dst + border * d_stride + border, d_stride, border,
                         border, d_width - 2 * border, d_height - 2 * border, 0,
                         0, best_error, segment_map, segment_map_stride);
      if (step_error < best_error) {
        best_error = step_error;
        best_param = *param;
        step_dir = 1;
      }

      // look to the direction chosen above repeatedly until error increases
      // for the biggest step size
      while (step_dir) {
        *param = add_param_offset(p, best_param, step * step_dir);
        force_wmtype(wm, wmtype);
        step_error =
            get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                           dst + border * d_stride + border, d_stride, border,
                           border, d_width - 2 * border, d_height - 2 * border,
                           0, 0, best_error, segment_map, segment_map_stride);
        if (step_error < best_error) {
          best_error = step_error;
          best_param = *param;
        } else {
          step_dir = 0;
        }
      }

      // Restore best parameter value so far
      *param = best_param;
      force_wmtype(wm, wmtype);
    }
  }

  wm->wmtype = get_wmtype(wm);
  // Recompute shear params for the refined model
  // This should never fail, because we only ever consider warp-able models
  if (!av1_get_shear_params(wm)) {
    assert(0);
  }
  return best_error;
}